

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::Name_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  CaseStyle CVar2;
  int iVar3;
  string name;
  string local_40;
  
  if ((Name[abi:cxx11](flatbuffers::FieldDef_const&)::union_suffix_len == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Name[abi:cxx11](flatbuffers::FieldDef_const&)::union_suffix_len),
     iVar3 != 0)) {
    Name::union_suffix_len = 5;
    __cxa_guard_release(&Name[abi:cxx11](flatbuffers::FieldDef_const&)::union_suffix_len);
  }
  if ((this->opts_).super_IDLOptions.cpp_object_api_field_case_style == CaseStyle_Unchanged) {
    EscapeKeyword(__return_storage_ptr__,this,(string *)field);
    return __return_storage_ptr__;
  }
  BVar1 = (field->value).type.base_type;
  std::__cxx11::string::string((string *)&name,(string *)field);
  if (BVar1 == BASE_TYPE_UTYPE) {
    if (name._M_string_length < Name::union_suffix_len ||
        name._M_string_length - Name::union_suffix_len == 0) {
      __assert_fail("name.length() > union_suffix_len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0x155,
                    "std::string flatbuffers::cpp::CppGenerator::Name(const FieldDef &) const");
    }
    std::__cxx11::string::erase((ulong)&name,name._M_string_length - Name::union_suffix_len);
  }
  CVar2 = (this->opts_).super_IDLOptions.cpp_object_api_field_case_style;
  if (CVar2 == CaseStyle_Lower) {
    ConvertCase(&local_40,&name,kLowerCamel,kSnake);
  }
  else {
    if (CVar2 != CaseStyle_Upper) goto LAB_0015fcbc;
    ConvertCase(&local_40,&name,kUpperCamel,kSnake);
  }
  std::__cxx11::string::operator=((string *)&name,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
LAB_0015fcbc:
  if (BVar1 == BASE_TYPE_UTYPE) {
    std::__cxx11::string::append((char *)&name,0x26bee5);
  }
  EscapeKeyword(__return_storage_ptr__,this,&name);
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string Name(const FieldDef &field) const {
    // the union type field suffix is immutable.
    static size_t union_suffix_len = strlen(UnionTypeFieldSuffix());
    const bool is_union_type = field.value.type.base_type == BASE_TYPE_UTYPE;
    // early return if no case transformation required
    if (opts_.cpp_object_api_field_case_style ==
        IDLOptions::CaseStyle_Unchanged)
      return EscapeKeyword(field.name);
    std::string name = field.name;
    // do not change the case style of the union type field suffix
    if (is_union_type) {
      FLATBUFFERS_ASSERT(name.length() > union_suffix_len);
      name.erase(name.length() - union_suffix_len, union_suffix_len);
    }
    if (opts_.cpp_object_api_field_case_style == IDLOptions::CaseStyle_Upper)
      name = ConvertCase(name, Case::kUpperCamel);
    else if (opts_.cpp_object_api_field_case_style ==
             IDLOptions::CaseStyle_Lower)
      name = ConvertCase(name, Case::kLowerCamel);
    // restore the union field type suffix
    if (is_union_type) name.append(UnionTypeFieldSuffix(), union_suffix_len);
    return EscapeKeyword(name);
  }